

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::insertAt
          (ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *this,size_t index,Name item)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Name *pNVar3;
  undefined8 uVar4;
  ulong uVar5;
  long lVar6;
  
  if (index <= this->usedElements) {
    resize(this,this->usedElements + 1);
    uVar5 = this->usedElements;
    lVar6 = uVar5 << 4;
    while( true ) {
      uVar5 = uVar5 - 1;
      pNVar3 = this->data;
      if (uVar5 <= index) break;
      puVar2 = (undefined8 *)((long)&pNVar3[-2].super_IString.str._M_len + lVar6);
      uVar4 = puVar2[1];
      puVar1 = (undefined8 *)((long)&pNVar3[-1].super_IString.str._M_len + lVar6);
      *puVar1 = *puVar2;
      puVar1[1] = uVar4;
      lVar6 = lVar6 + -0x10;
    }
    pNVar3[index].super_IString.str._M_len = item.super_IString.str._M_len;
    pNVar3[index].super_IString.str._M_str = item.super_IString.str._M_str;
    return;
  }
  __assert_fail("index <= size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                ,0x174,
                "void ArenaVectorBase<ArenaVector<wasm::Name>, wasm::Name>::insertAt(size_t, T) [SubType = ArenaVector<wasm::Name>, T = wasm::Name]"
               );
}

Assistant:

void insertAt(size_t index, T item) {
    assert(index <= size()); // appending is ok
    resize(size() + 1);
    for (auto i = size() - 1; i > index; --i) {
      data[i] = data[i - 1];
    }
    data[index] = item;
  }